

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O1

dtype __thiscall pybind11::dtype::strip_padding(dtype *this,ssize_t itemsize)

{
  PyObject *pPVar1;
  pointer pfVar2;
  bool bVar3;
  handle *phVar4;
  size_type __n;
  long lVar5;
  long *plVar6;
  error_already_set *this_00;
  ulong uVar7;
  ssize_t in_RDX;
  pointer val;
  iterator *self;
  list formats;
  list names;
  list offsets;
  tuple spec;
  dict field_dict;
  dtype format;
  tuple spec_fo;
  vector<field_descr,_std::allocator<field_descr>_> field_descriptors;
  str name;
  int_ offset;
  handle field;
  iterator local_f8;
  accessor<pybind11::detail::accessor_policies::str_attr> local_e8;
  iterator local_c8;
  handle local_b0;
  handle local_a8;
  long local_a0;
  PyObject *local_98;
  object local_90;
  vector<field_descr,_std::allocator<field_descr>_> local_88;
  handle local_70;
  handle local_68;
  handle local_60;
  undefined8 local_58;
  ssize_t local_50;
  handle local_48;
  pybind11 local_40 [8];
  handle local_38;
  
  local_e8.obj.m_ptr = *(PyObject **)itemsize;
  if (local_e8.obj.m_ptr[3].ob_type == (PyTypeObject *)0x0) {
    pPVar1 = *(PyObject **)itemsize;
    (this->super_object).super_handle.m_ptr = pPVar1;
    plVar6 = (long *)__tls_get_addr(&PTR_0019ddc0);
    *plVar6 = *plVar6 + 1;
    if (pPVar1 != (PyObject *)0x0) {
      pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    }
  }
  else {
    local_e8.key = "fields";
    local_e8.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_50 = in_RDX;
    phVar4 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_e8)
              ->super_handle;
    cast<pybind11::dict,_0>((pybind11 *)&local_a8,phVar4);
    object::~object(&local_e8.cache);
    local_88.super__Vector_base<field_descr,_std::allocator<field_descr>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<field_descr,_std::allocator<field_descr>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<field_descr,_std::allocator<field_descr>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __n = PyDict_Size(local_a8.m_ptr);
    std::vector<field_descr,_std::allocator<field_descr>_>::reserve(&local_88,__n);
    local_e8.obj.m_ptr = local_a8.m_ptr;
    local_e8.key = "items";
    local_e8.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    detail::object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
    operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                *)&local_90);
    local_48.m_ptr = (PyObject *)this;
    object::~object(&local_e8.cache);
    detail::object_api<pybind11::handle>::begin((object_api<pybind11::handle> *)&local_f8);
    local_c8.super_object.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_c8.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
    while( true ) {
      bVar3 = operator!=(&local_f8,&local_c8);
      if (!bVar3) break;
      if ((local_f8.super_object.super_handle.m_ptr != (PyObject *)0x0) &&
         (local_f8.value.super_handle.m_ptr == (PyObject *)0x0)) {
        iterator::advance(&local_f8);
      }
      local_38 = local_f8.value.super_handle.m_ptr;
      cast<pybind11::tuple,_0>((pybind11 *)&local_b0,&local_38);
      local_e8.obj.m_ptr = local_b0.m_ptr;
      local_e8.key = (key_type)0x0;
      local_e8.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      phVar4 = &detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&local_e8)->
                super_handle;
      cast<pybind11::str,_0>((pybind11 *)&local_58,phVar4);
      object::~object(&local_e8.cache);
      local_e8.obj.m_ptr = local_b0.m_ptr;
      local_e8.key = (key_type)0x1;
      local_e8.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      phVar4 = &detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&local_e8)->
                super_handle;
      cast<pybind11::tuple,_0>((pybind11 *)&local_98,phVar4);
      object::~object(&local_e8.cache);
      local_e8.obj.m_ptr = local_98;
      local_e8.key = (key_type)0x0;
      local_e8.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      phVar4 = &detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&local_e8)->
                super_handle;
      cast<pybind11::dtype,_0>((pybind11 *)&local_a0,phVar4);
      object::~object(&local_e8.cache);
      local_e8.obj.m_ptr = local_98;
      local_e8.key = (char *)0x1;
      local_e8.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      phVar4 = &detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&local_e8)->
                super_handle;
      cast<pybind11::int_,_0>(local_40,phVar4);
      object::~object(&local_e8.cache);
      lVar5 = PyObject_Size(local_58);
      if (lVar5 < 0) {
        this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
        error_already_set::error_already_set(this_00);
        __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
      }
      if ((lVar5 != 0) || (*(char *)(local_a0 + 0x18) != 'V')) {
        strip_padding((dtype *)&local_e8,(ssize_t)&local_a0);
        std::
        vector<pybind11::dtype::strip_padding(long)::field_descr,std::allocator<pybind11::dtype::strip_padding(long)::field_descr>>
        ::emplace_back<pybind11::str,pybind11::dtype,pybind11::int_>
                  ((vector<pybind11::dtype::strip_padding(long)::field_descr,std::allocator<pybind11::dtype::strip_padding(long)::field_descr>>
                    *)&local_88,(str *)&local_58,(dtype *)&local_e8,(int_ *)local_40);
        object::~object((object *)&local_e8);
      }
      object::~object((object *)local_40);
      object::~object((object *)&local_a0);
      object::~object((object *)&local_98);
      object::~object((object *)&local_58);
      object::~object((object *)&local_b0);
      iterator::advance(&local_f8);
    }
    object::~object(&local_c8.value);
    object::~object(&local_c8.super_object);
    object::~object(&local_f8.value);
    object::~object(&local_f8.super_object);
    object::~object(&local_90);
    this = (dtype *)local_48.m_ptr;
    pfVar2 = local_88.super__Vector_base<field_descr,_std::allocator<field_descr>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_88.super__Vector_base<field_descr,_std::allocator<field_descr>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_88.super__Vector_base<field_descr,_std::allocator<field_descr>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar7 = ((long)local_88.super__Vector_base<field_descr,_std::allocator<field_descr>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_88.super__Vector_base<field_descr,_std::allocator<field_descr>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<pybind11::dtype::strip_padding(long)::field_descr*,std::vector<pybind11::dtype::strip_padding(long)::field_descr,std::allocator<pybind11::dtype::strip_padding(long)::field_descr>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<pybind11::dtype::strip_padding(long)::_lambda(pybind11::dtype::strip_padding(long)::field_descr_const&,pybind11::dtype::strip_padding(long)::field_descr_const&)_1_>>
                (local_88.super__Vector_base<field_descr,_std::allocator<field_descr>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_88.super__Vector_base<field_descr,_std::allocator<field_descr>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<pybind11::dtype::strip_padding(long)::field_descr*,std::vector<pybind11::dtype::strip_padding(long)::field_descr,std::allocator<pybind11::dtype::strip_padding(long)::field_descr>>>,__gnu_cxx::__ops::_Iter_comp_iter<pybind11::dtype::strip_padding(long)::_lambda(pybind11::dtype::strip_padding(long)::field_descr_const&,pybind11::dtype::strip_padding(long)::field_descr_const&)_1_>>
                (pfVar2);
    }
    list::list<long,_0>((list *)&local_e8,0);
    list::list<long,_0>((list *)&local_f8,0);
    list::list<long,_0>((list *)&local_c8,0);
    pfVar2 = local_88.super__Vector_base<field_descr,_std::allocator<field_descr>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_88.super__Vector_base<field_descr,_std::allocator<field_descr>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_88.super__Vector_base<field_descr,_std::allocator<field_descr>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      val = local_88.super__Vector_base<field_descr,_std::allocator<field_descr>_>._M_impl.
            super__Vector_impl_data._M_start;
      do {
        list::append<pybind11::str>((list *)&local_e8,&val->name);
        list::append<pybind11::object>((list *)&local_f8,&val->format);
        list::append<pybind11::int_>((list *)&local_c8,&val->offset);
        val = val + 1;
      } while (val != pfVar2);
    }
    local_60.m_ptr = (PyObject *)local_e8._0_8_;
    local_e8._0_8_ = (PyObject *)0x0;
    local_68 = local_f8.super_object.super_handle.m_ptr;
    local_f8.super_object.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_70 = local_c8.super_object.super_handle.m_ptr;
    local_c8.super_object.super_handle.m_ptr = (handle)(PyObject *)0x0;
    dtype(this,(list *)&local_60,(list *)&local_68,(list *)&local_70,local_50);
    object::~object((object *)&local_70);
    object::~object((object *)&local_68);
    object::~object((object *)&local_60);
    object::~object(&local_c8.super_object);
    object::~object(&local_f8.super_object);
    object::~object((object *)&local_e8);
    std::vector<field_descr,_std::allocator<field_descr>_>::~vector(&local_88);
    object::~object((object *)&local_a8);
  }
  return (dtype)(PyObject *)this;
}

Assistant:

dtype strip_padding(ssize_t itemsize) {
        // Recursively strip all void fields with empty names that are generated for
        // padding fields (as of NumPy v1.11).
        if (!has_fields()) {
            return *this;
        }

        struct field_descr {
            pybind11::str name;
            object format;
            pybind11::int_ offset;
            field_descr(pybind11::str &&name, object &&format, pybind11::int_ &&offset)
                : name{std::move(name)}, format{std::move(format)}, offset{std::move(offset)} {};
        };
        auto field_dict = attr("fields").cast<dict>();
        std::vector<field_descr> field_descriptors;
        field_descriptors.reserve(field_dict.size());

        for (auto field : field_dict.attr("items")()) {
            auto spec = field.cast<tuple>();
            auto name = spec[0].cast<pybind11::str>();
            auto spec_fo = spec[1].cast<tuple>();
            auto format = spec_fo[0].cast<dtype>();
            auto offset = spec_fo[1].cast<pybind11::int_>();
            if ((len(name) == 0u) && format.kind() == 'V') {
                continue;
            }
            field_descriptors.emplace_back(
                std::move(name), format.strip_padding(format.itemsize()), std::move(offset));
        }

        std::sort(field_descriptors.begin(),
                  field_descriptors.end(),
                  [](const field_descr &a, const field_descr &b) {
                      return a.offset.cast<int>() < b.offset.cast<int>();
                  });

        list names, formats, offsets;
        for (auto &descr : field_descriptors) {
            names.append(std::move(descr.name));
            formats.append(std::move(descr.format));
            offsets.append(std::move(descr.offset));
        }
        return dtype(std::move(names), std::move(formats), std::move(offsets), itemsize);
    }